

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set
          (string *__return_storage_ptr__,Option *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *target,string_view param_2,string_view value)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *target_local;
  Option *this_local;
  string_view param_2_local;
  
  std::optional<std::__cxx11::string>::operator=((optional<std::__cxx11::string> *)target,&value);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::optional<std::string>& target, string_view,
                                     string_view value) {
    target = value;
    return {};
}